

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericMouseInput.cpp
# Opt level: O2

void __thiscall fw::GenericMouseInput::nextFrame(GenericMouseInput *this)

{
  anon_union_16_3_e2189aaa_for_tvec2<double,_(glm::precision)0>_2 aVar1;
  double dVar2;
  
  changeTapsToPresses(this);
  dVar2 = (this->_currentPosition).field_0.field_0.y;
  (this->_previousPosition).field_0.field_0.x = (this->_currentPosition).field_0.field_0.x;
  (this->_previousPosition).field_0.field_0.y = dVar2;
  dVar2 = (this->_currentPosition).field_0.field_0.y - (this->_previousPosition).field_0.field_0.y;
  aVar1._8_4_ = SUB84(dVar2,0);
  aVar1.field_0.x =
       (this->_currentPosition).field_0.field_0.x - (this->_previousPosition).field_0.field_0.x;
  aVar1._12_4_ = (int)((ulong)dVar2 >> 0x20);
  (this->_movement).field_0 = aVar1;
  return;
}

Assistant:

void GenericMouseInput::nextFrame()
{
    changeTapsToPresses();
    _previousPosition = _currentPosition;
    _movement = _currentPosition - _previousPosition;
}